

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

void __thiscall Path::Path(Path *this,string *in)

{
  undefined1 local_48 [56];
  string *in_local;
  Path *this_local;
  
  local_48._48_8_ = in;
  in_local = &this->_original;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_data);
  std::__cxx11::string::operator=((string *)this,(string *)local_48._48_8_);
  expand((Path *)local_48,(string *)local_48._48_8_);
  std::__cxx11::string::operator=((string *)&this->_data,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

Path::Path (const std::string& in)
{
  _original = in;
  _data     = expand (in);
}